

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void AnalyzeClassElements
               (ExpressionContext *ctx,ExprClassDefinition *classDefinition,SynClassElements *syntax
               )

{
  TypeClass *pTVar1;
  
  AnalyzeClassBaseElements(ctx,classDefinition,syntax);
  anon_unknown.dwarf_c3752::FinalizeAlignment(&classDefinition->classType->super_TypeStruct);
  pTVar1 = classDefinition->classType;
  if (pTVar1->completed == true) {
    __assert_fail("!classDefinition->classType->completed",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x295b,
                  "void AnalyzeClassElements(ExpressionContext &, ExprClassDefinition *, SynClassElements *)"
                 );
  }
  pTVar1->completed = true;
  if ((pTVar1->super_TypeStruct).super_TypeBase.size < 0x10000) {
    CreateDefaultClassMembers(ctx,&syntax->super_SynBase,classDefinition);
    AnalyzeClassFunctionElements(ctx,classDefinition,syntax);
    return;
  }
  anon_unknown.dwarf_c3752::Stop
            (ctx,&syntax->super_SynBase,"ERROR: class size cannot exceed 65535 bytes");
}

Assistant:

void AnalyzeClassElements(ExpressionContext &ctx, ExprClassDefinition *classDefinition, SynClassElements *syntax)
{
	AnalyzeClassBaseElements(ctx, classDefinition, syntax);

	FinalizeAlignment(classDefinition->classType);

	assert(!classDefinition->classType->completed);

	classDefinition->classType->completed = true;

	if(classDefinition->classType->size >= 64 * 1024)
		Stop(ctx, syntax, "ERROR: class size cannot exceed 65535 bytes");

	CreateDefaultClassMembers(ctx, syntax, classDefinition);

	AnalyzeClassFunctionElements(ctx, classDefinition, syntax);
}